

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::PrivateToLocalPass::IsValidUse(PrivateToLocalPass *this,Instruction *inst)

{
  Instruction *def;
  CommonDebugInfoInstructions CVar1;
  Op OVar2;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_8_1_8991fb9c local_48;
  function<bool_(spvtools::opt::Instruction_*)> local_40;
  Instruction *local_20;
  Instruction *inst_local;
  PrivateToLocalPass *this_local;
  
  local_20 = inst;
  inst_local = (Instruction *)this;
  CVar1 = opt::Instruction::GetCommonDebugOpcode(inst);
  if (CVar1 == CommonDebugInfoDebugGlobalVariable) {
    this_local._7_1_ = 1;
  }
  else {
    OVar2 = opt::Instruction::opcode(local_20);
    if (OVar2 == OpName) {
      this_local._7_1_ = 1;
    }
    else if (OVar2 - OpImageTexelPointer < 3) {
      this_local._7_1_ = 1;
    }
    else if (OVar2 == OpAccessChain) {
      this_00 = Pass::context(&this->super_Pass);
      this_01 = IRContext::get_def_use_mgr(this_00);
      def = local_20;
      local_48.this = this;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::PrivateToLocalPass::IsValidUse(spvtools::opt::Instruction_const*)const::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_40,&local_48);
      this_local._7_1_ = analysis::DefUseManager::WhileEachUser(this_01,def,&local_40);
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_40);
    }
    else {
      OVar2 = opt::Instruction::opcode(local_20);
      this_local._7_1_ = spvOpcodeIsDecoration(OVar2);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PrivateToLocalPass::IsValidUse(const Instruction* inst) const {
  // The cases in this switch have to match the cases in |UpdateUse|.
  // If we don't know how to update it, it is not valid.
  if (inst->GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
    return true;
  }
  switch (inst->opcode()) {
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpImageTexelPointer:  // Treat like a load
      return true;
    case spv::Op::OpAccessChain:
      return context()->get_def_use_mgr()->WhileEachUser(
          inst, [this](const Instruction* user) {
            if (!IsValidUse(user)) return false;
            return true;
          });
    case spv::Op::OpName:
      return true;
    default:
      return spvOpcodeIsDecoration(inst->opcode());
  }
}